

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O3

int CRYPTO_memcmp(void *a,void *b,size_t len)

{
  size_t sVar1;
  byte bVar2;
  
  if (len != 0) {
    sVar1 = 0;
    bVar2 = 0;
    do {
      bVar2 = bVar2 | *(byte *)((long)b + sVar1) ^ *(byte *)((long)a + sVar1);
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
    return (int)bVar2;
  }
  return 0;
}

Assistant:

int CRYPTO_memcmp(const void *in_a, const void *in_b, size_t len) {
  const uint8_t *a = reinterpret_cast<const uint8_t *>(in_a);
  const uint8_t *b = reinterpret_cast<const uint8_t *>(in_b);
  uint8_t x = 0;

  for (size_t i = 0; i < len; i++) {
    x |= a[i] ^ b[i];
  }

  return x;
}